

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_timidity_mididevice.cpp
# Opt level: O0

void __thiscall
TimidityWaveWriterMIDIDevice::TimidityWaveWriterMIDIDevice
          (TimidityWaveWriterMIDIDevice *this,char *filename,int rate)

{
  FILE *pFVar1;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  undefined4 local_68;
  undefined4 local_64;
  FmtChunk fmt;
  DWORD work [3];
  int rate_local;
  char *filename_local;
  TimidityWaveWriterMIDIDevice *this_local;
  
  TimidityMIDIDevice::TimidityMIDIDevice(&this->super_TimidityMIDIDevice,(char *)0x0);
  (this->super_TimidityMIDIDevice).super_SoftSynthMIDIDevice.super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__TimidityWaveWriterMIDIDevice_00b664c8;
  pFVar1 = fopen(filename,"wb");
  this->File = (FILE *)pFVar1;
  if (this->File != (FILE *)0x0) {
    builtin_memcpy(fmt.SubFormatD,"RIFF",5);
    fmt.SubFormatD[5] = '\0';
    fmt.SubFormatD[6] = '\0';
    fmt.SubFormatD[7] = '\0';
    sVar2 = fwrite(fmt.SubFormatD,4,3,(FILE *)this->File);
    if (sVar2 == 3) {
      local_68 = 0x20746d66;
      local_64 = 0x28;
      fmt.ChunkID._0_2_ = 0xfffe;
      fmt.ChunkID._2_2_ = 2;
      fmt.ChunkLen = (DWORD)((this->super_TimidityMIDIDevice).Renderer)->rate;
      fmt._8_4_ = (int)((this->super_TimidityMIDIDevice).Renderer)->rate << 3;
      fmt.SamplesPerSec._0_2_ = 8;
      fmt.SamplesPerSec._2_2_ = 0x20;
      fmt.AvgBytesPerSec._0_2_ = 0x16;
      fmt.AvgBytesPerSec._2_2_ = 0x20;
      fmt.BlockAlign = 3;
      fmt.BitsPerSample = 0;
      fmt.ExtensionSize = 3;
      fmt.ValidBitsPerSample = 0;
      fmt.ChannelMask._0_2_ = 0;
      fmt.ChannelMask._2_2_ = 0x10;
      fmt.SubFormatA._0_1_ = 0x80;
      fmt.SubFormatA._1_1_ = 0;
      fmt.SubFormatA._2_1_ = 0;
      fmt.SubFormatA._3_1_ = 0xaa;
      fmt.SubFormatB._0_1_ = 0;
      fmt.SubFormatB._1_1_ = 0x38;
      fmt.SubFormatC._0_1_ = 0x9b;
      fmt.SubFormatC._1_1_ = 0x71;
      sVar2 = fwrite(&local_68,0x30,1,(FILE *)this->File);
      if (sVar2 == 1) {
        builtin_memcpy(fmt.SubFormatD,"data",5);
        fmt.SubFormatD[5] = '\0';
        fmt.SubFormatD[6] = '\0';
        fmt.SubFormatD[7] = '\0';
        sVar2 = fwrite(fmt.SubFormatD,4,2,(FILE *)this->File);
        if (sVar2 == 2) {
          return;
        }
      }
    }
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    Printf("Failed to write %s: %s\n",filename,pcVar4);
    fclose((FILE *)this->File);
    this->File = (FILE *)0x0;
  }
  return;
}

Assistant:

TimidityWaveWriterMIDIDevice::TimidityWaveWriterMIDIDevice(const char *filename, int rate)
	:TimidityMIDIDevice(NULL)
{
	File = fopen(filename, "wb");
	if (File != NULL)
	{ // Write wave header
		DWORD work[3];
		FmtChunk fmt;

		work[0] = MAKE_ID('R','I','F','F');
		work[1] = 0;								// filled in later
		work[2] = MAKE_ID('W','A','V','E');
		if (3 != fwrite(work, 4, 3, File)) goto fail;

		fmt.ChunkID = MAKE_ID('f','m','t',' ');
		fmt.ChunkLen = LittleLong(DWORD(sizeof(fmt) - 8));
		fmt.FormatTag = LittleShort(0xFFFE);		// WAVE_FORMAT_EXTENSIBLE
		fmt.Channels = LittleShort(2);
		fmt.SamplesPerSec = LittleLong((int)Renderer->rate);
		fmt.AvgBytesPerSec = LittleLong((int)Renderer->rate * 8);
		fmt.BlockAlign = LittleShort(8);
		fmt.BitsPerSample = LittleShort(32);
		fmt.ExtensionSize = LittleShort(2 + 4 + 16);
		fmt.ValidBitsPerSample = LittleShort(32);
		fmt.ChannelMask = LittleLong(3);
		fmt.SubFormatA = LittleLong(0x00000003);	// Set subformat to KSDATAFORMAT_SUBTYPE_IEEE_FLOAT
		fmt.SubFormatB = LittleShort(0x0000);
		fmt.SubFormatC = LittleShort(0x0010);
		fmt.SubFormatD[0] = 0x80;
		fmt.SubFormatD[1] = 0x00;
		fmt.SubFormatD[2] = 0x00;
		fmt.SubFormatD[3] = 0xaa;
		fmt.SubFormatD[4] = 0x00;
		fmt.SubFormatD[5] = 0x38;
		fmt.SubFormatD[6] = 0x9b;
		fmt.SubFormatD[7] = 0x71;
		if (1 != fwrite(&fmt, sizeof(fmt), 1, File)) goto fail;

		work[0] = MAKE_ID('d','a','t','a');
		work[1] = 0;								// filled in later
		if (2 != fwrite(work, 4, 2, File)) goto fail;

		return;
fail:
		Printf("Failed to write %s: %s\n", filename, strerror(errno));
		fclose(File);
		File = NULL;
	}
}